

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O3

int StopThreadMTx(MT *pMT)

{
  CRITICAL_SECTION *__mutex;
  long lVar1;
  
  __mutex = MTCS;
  lVar1 = 0;
  do {
    if (*(MT **)((long)addrsMT + lVar1 * 2) == pMT) {
      *(undefined4 *)((long)bExitMT + lVar1) = 1;
      pthread_join(*(pthread_t *)((long)MTThreadId + lVar1 * 2),(void **)0x0);
      pthread_mutex_destroy((pthread_mutex_t *)__mutex);
      *(undefined4 *)((long)resMT + lVar1) = 1;
      return 0;
    }
    lVar1 = lVar1 + 4;
    __mutex = __mutex + 1;
  } while (lVar1 != 0x40);
  return 1;
}

Assistant:

HARDWAREX_API int StopThreadMTx(MT* pMT)
{
	int id = 0;

	while (addrsMT[id] != pMT)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	bExitMT[id] = TRUE;
	WaitForThread(MTThreadId[id]);
	DeleteCriticalSection(&MTCS[id]);
	resMT[id] = EXIT_FAILURE;
	return EXIT_SUCCESS;
}